

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTest.hpp
# Opt level: O0

void Qentem::Test::TestStringCompare(QTest *test)

{
  bool bVar1;
  char *local_38;
  char *str3;
  QString str2;
  QString str1;
  QTest *test_local;
  
  String<char>::String((String<char> *)&str2.length_,"a");
  String<char>::String((String<char> *)&str3,"a");
  local_38 = "a";
  QTest::IsEqual<Qentem::String<char>,Qentem::String<char>>
            (test,(String<char> *)&str2.length_,(String<char> *)&str3,0x8e);
  QTest::IsEqual<Qentem::String<char>,Qentem::String<char>>
            (test,(String<char> *)&str3,(String<char> *)&str2.length_,0x8f);
  QTest::IsEqual<Qentem::String<char>,char_const*>
            (test,(String<char> *)&str2.length_,&local_38,0x90);
  QTest::IsEqual<Qentem::String<char>,char_const*>(test,(String<char> *)&str3,&local_38,0x91);
  String<char>::operator=((String<char> *)&str2.length_,"abc");
  String<char>::operator=((String<char> *)&str3,"abc");
  local_38 = "abc";
  QTest::IsEqual<Qentem::String<char>,Qentem::String<char>>
            (test,(String<char> *)&str2.length_,(String<char> *)&str3,0x96);
  QTest::IsEqual<Qentem::String<char>,Qentem::String<char>>
            (test,(String<char> *)&str3,(String<char> *)&str2.length_,0x97);
  QTest::IsEqual<Qentem::String<char>,char_const*>
            (test,(String<char> *)&str2.length_,&local_38,0x98);
  QTest::IsEqual<Qentem::String<char>,char_const*>(test,(String<char> *)&str3,&local_38,0x99);
  String<char>::operator=((String<char> *)&str2.length_,"a");
  String<char>::operator=((String<char> *)&str3,"b");
  local_38 = "c";
  QTest::IsNotEqual<Qentem::String<char>,Qentem::String<char>>
            (test,(String<char> *)&str2.length_,(String<char> *)&str3,0x9e);
  QTest::IsNotEqual<Qentem::String<char>,Qentem::String<char>>
            (test,(String<char> *)&str3,(String<char> *)&str2.length_,0x9f);
  QTest::IsNotEqual<Qentem::String<char>,char_const*>
            (test,(String<char> *)&str2.length_,&local_38,0xa0);
  QTest::IsNotEqual<Qentem::String<char>,char_const*>(test,(String<char> *)&str3,&local_38,0xa1);
  String<char>::operator=((String<char> *)&str2.length_,"abc");
  String<char>::operator=((String<char> *)&str3,"efg");
  local_38 = "hij";
  QTest::IsNotEqual<Qentem::String<char>,Qentem::String<char>>
            (test,(String<char> *)&str2.length_,(String<char> *)&str3,0xa6);
  QTest::IsNotEqual<Qentem::String<char>,Qentem::String<char>>
            (test,(String<char> *)&str3,(String<char> *)&str2.length_,0xa7);
  QTest::IsNotEqual<Qentem::String<char>,char_const*>
            (test,(String<char> *)&str2.length_,&local_38,0xa8);
  QTest::IsNotEqual<Qentem::String<char>,char_const*>(test,(String<char> *)&str3,&local_38,0xa9);
  String<char>::operator=((String<char> *)&str2.length_,"a");
  String<char>::operator=((String<char> *)&str3,"ef");
  local_38 = "abc";
  QTest::IsNotEqual<Qentem::String<char>,Qentem::String<char>>
            (test,(String<char> *)&str2.length_,(String<char> *)&str3,0xae);
  QTest::IsNotEqual<Qentem::String<char>,Qentem::String<char>>
            (test,(String<char> *)&str3,(String<char> *)&str2.length_,0xaf);
  QTest::IsNotEqual<Qentem::String<char>,char_const*>
            (test,(String<char> *)&str2.length_,&local_38,0xb0);
  QTest::IsNotEqual<Qentem::String<char>,char_const*>(test,(String<char> *)&str3,&local_38,0xb1);
  String<char>::operator=((String<char> *)&str2.length_,"");
  bVar1 = String<char>::IsEqual((String<char> *)&str2.length_," ",1);
  QTest::IsFalse(test,bVar1,0xb4);
  String<char>::operator=((String<char> *)&str2.length_,"");
  String<char>::operator=((String<char> *)&str3,"");
  bVar1 = String<char>::operator>=((String<char> *)&str2.length_,(String<char> *)&str3);
  QTest::IsTrue(test,bVar1,0xb8);
  bVar1 = String<char>::operator<=((String<char> *)&str2.length_,(String<char> *)&str3);
  QTest::IsTrue(test,bVar1,0xb9);
  bVar1 = String<char>::operator>((String<char> *)&str2.length_,(String<char> *)&str3);
  QTest::IsFalse(test,bVar1,0xba);
  bVar1 = String<char>::operator<((String<char> *)&str2.length_,(String<char> *)&str3);
  QTest::IsFalse(test,bVar1,0xbb);
  String<char>::operator=((String<char> *)&str2.length_,"a");
  String<char>::operator=((String<char> *)&str3,"a");
  bVar1 = String<char>::operator>=((String<char> *)&str2.length_,(String<char> *)&str3);
  QTest::IsTrue(test,bVar1,0xbf);
  bVar1 = String<char>::operator<=((String<char> *)&str2.length_,(String<char> *)&str3);
  QTest::IsTrue(test,bVar1,0xc0);
  bVar1 = String<char>::operator>((String<char> *)&str2.length_,(String<char> *)&str3);
  QTest::IsFalse(test,bVar1,0xc1);
  bVar1 = String<char>::operator<((String<char> *)&str2.length_,(String<char> *)&str3);
  QTest::IsFalse(test,bVar1,0xc2);
  String<char>::operator=((String<char> *)&str2.length_,"a");
  String<char>::operator=((String<char> *)&str3,"A");
  bVar1 = String<char>::operator>=((String<char> *)&str2.length_,(String<char> *)&str3);
  QTest::IsTrue(test,bVar1,0xc6);
  bVar1 = String<char>::operator>((String<char> *)&str2.length_,(String<char> *)&str3);
  QTest::IsTrue(test,bVar1,199);
  bVar1 = String<char>::operator<=((String<char> *)&str2.length_,(String<char> *)&str3);
  QTest::IsFalse(test,bVar1,200);
  bVar1 = String<char>::operator<((String<char> *)&str2.length_,(String<char> *)&str3);
  QTest::IsFalse(test,bVar1,0xc9);
  bVar1 = String<char>::operator>=((String<char> *)&str3,(String<char> *)&str2.length_);
  QTest::IsFalse(test,bVar1,0xcb);
  bVar1 = String<char>::operator>((String<char> *)&str3,(String<char> *)&str2.length_);
  QTest::IsFalse(test,bVar1,0xcc);
  bVar1 = String<char>::operator<=((String<char> *)&str3,(String<char> *)&str2.length_);
  QTest::IsTrue(test,bVar1,0xcd);
  bVar1 = String<char>::operator<((String<char> *)&str3,(String<char> *)&str2.length_);
  QTest::IsTrue(test,bVar1,0xce);
  String<char>::operator=((String<char> *)&str2.length_,"a");
  String<char>::operator=((String<char> *)&str3,"B");
  bVar1 = String<char>::operator>=((String<char> *)&str2.length_,(String<char> *)&str3);
  QTest::IsTrue(test,bVar1,0xd2);
  bVar1 = String<char>::operator>((String<char> *)&str2.length_,(String<char> *)&str3);
  QTest::IsTrue(test,bVar1,0xd3);
  bVar1 = String<char>::operator<=((String<char> *)&str2.length_,(String<char> *)&str3);
  QTest::IsFalse(test,bVar1,0xd4);
  bVar1 = String<char>::operator<((String<char> *)&str2.length_,(String<char> *)&str3);
  QTest::IsFalse(test,bVar1,0xd5);
  bVar1 = String<char>::operator>=((String<char> *)&str3,(String<char> *)&str2.length_);
  QTest::IsFalse(test,bVar1,0xd7);
  bVar1 = String<char>::operator>((String<char> *)&str3,(String<char> *)&str2.length_);
  QTest::IsFalse(test,bVar1,0xd8);
  bVar1 = String<char>::operator<=((String<char> *)&str3,(String<char> *)&str2.length_);
  QTest::IsTrue(test,bVar1,0xd9);
  bVar1 = String<char>::operator<((String<char> *)&str3,(String<char> *)&str2.length_);
  QTest::IsTrue(test,bVar1,0xda);
  String<char>::operator=((String<char> *)&str2.length_,"aa");
  String<char>::operator=((String<char> *)&str3,"aA");
  bVar1 = String<char>::operator>=((String<char> *)&str2.length_,(String<char> *)&str3);
  QTest::IsTrue(test,bVar1,0xde);
  bVar1 = String<char>::operator>((String<char> *)&str2.length_,(String<char> *)&str3);
  QTest::IsTrue(test,bVar1,0xdf);
  bVar1 = String<char>::operator<=((String<char> *)&str2.length_,(String<char> *)&str3);
  QTest::IsFalse(test,bVar1,0xe0);
  bVar1 = String<char>::operator<((String<char> *)&str2.length_,(String<char> *)&str3);
  QTest::IsFalse(test,bVar1,0xe1);
  bVar1 = String<char>::operator>=((String<char> *)&str3,(String<char> *)&str2.length_);
  QTest::IsFalse(test,bVar1,0xe3);
  bVar1 = String<char>::operator>((String<char> *)&str3,(String<char> *)&str2.length_);
  QTest::IsFalse(test,bVar1,0xe4);
  bVar1 = String<char>::operator<=((String<char> *)&str3,(String<char> *)&str2.length_);
  QTest::IsTrue(test,bVar1,0xe5);
  bVar1 = String<char>::operator<((String<char> *)&str3,(String<char> *)&str2.length_);
  QTest::IsTrue(test,bVar1,0xe6);
  String<char>::operator=((String<char> *)&str2.length_,"2021");
  String<char>::operator=((String<char> *)&str3,"2018");
  bVar1 = String<char>::operator>=((String<char> *)&str2.length_,(String<char> *)&str3);
  QTest::IsTrue(test,bVar1,0xea);
  bVar1 = String<char>::operator>((String<char> *)&str2.length_,(String<char> *)&str3);
  QTest::IsTrue(test,bVar1,0xeb);
  bVar1 = String<char>::operator<=((String<char> *)&str2.length_,(String<char> *)&str3);
  QTest::IsFalse(test,bVar1,0xec);
  bVar1 = String<char>::operator<((String<char> *)&str2.length_,(String<char> *)&str3);
  QTest::IsFalse(test,bVar1,0xed);
  bVar1 = String<char>::operator>=((String<char> *)&str3,(String<char> *)&str2.length_);
  QTest::IsFalse(test,bVar1,0xef);
  bVar1 = String<char>::operator>((String<char> *)&str3,(String<char> *)&str2.length_);
  QTest::IsFalse(test,bVar1,0xf0);
  bVar1 = String<char>::operator<=((String<char> *)&str3,(String<char> *)&str2.length_);
  QTest::IsTrue(test,bVar1,0xf1);
  bVar1 = String<char>::operator<((String<char> *)&str3,(String<char> *)&str2.length_);
  QTest::IsTrue(test,bVar1,0xf2);
  String<char>::~String((String<char> *)&str3);
  String<char>::~String((String<char> *)&str2.length_);
  return;
}

Assistant:

static void TestStringCompare(QTest &test) {
    QString     str1("a");
    QString     str2("a");
    const char *str3 = "a";

    test.IsEqual(str1, str2, __LINE__);
    test.IsEqual(str2, str1, __LINE__);
    test.IsEqual(str1, str3, __LINE__);
    test.IsEqual(str2, str3, __LINE__);

    str1 = "abc";
    str2 = "abc";
    str3 = "abc";
    test.IsEqual(str1, str2, __LINE__);
    test.IsEqual(str2, str1, __LINE__);
    test.IsEqual(str1, str3, __LINE__);
    test.IsEqual(str2, str3, __LINE__);

    str1 = "a";
    str2 = "b";
    str3 = "c";
    test.IsNotEqual(str1, str2, __LINE__);
    test.IsNotEqual(str2, str1, __LINE__);
    test.IsNotEqual(str1, str3, __LINE__);
    test.IsNotEqual(str2, str3, __LINE__);

    str1 = "abc";
    str2 = "efg";
    str3 = "hij";
    test.IsNotEqual(str1, str2, __LINE__);
    test.IsNotEqual(str2, str1, __LINE__);
    test.IsNotEqual(str1, str3, __LINE__);
    test.IsNotEqual(str2, str3, __LINE__);

    str1 = "a";
    str2 = "ef";
    str3 = "abc";
    test.IsNotEqual(str1, str2, __LINE__);
    test.IsNotEqual(str2, str1, __LINE__);
    test.IsNotEqual(str1, str3, __LINE__);
    test.IsNotEqual(str2, str3, __LINE__);

    str1 = "";
    test.IsFalse(str1.IsEqual(" ", 1U), __LINE__);

    str1 = "";
    str2 = "";
    test.IsTrue((str1 >= str2), __LINE__);
    test.IsTrue((str1 <= str2), __LINE__);
    test.IsFalse((str1 > str2), __LINE__);
    test.IsFalse((str1 < str2), __LINE__);

    str1 = "a";
    str2 = "a";
    test.IsTrue((str1 >= str2), __LINE__);
    test.IsTrue((str1 <= str2), __LINE__);
    test.IsFalse((str1 > str2), __LINE__);
    test.IsFalse((str1 < str2), __LINE__);

    str1 = "a";
    str2 = "A";
    test.IsTrue((str1 >= str2), __LINE__);
    test.IsTrue((str1 > str2), __LINE__);
    test.IsFalse((str1 <= str2), __LINE__);
    test.IsFalse((str1 < str2), __LINE__);
    //
    test.IsFalse((str2 >= str1), __LINE__);
    test.IsFalse((str2 > str1), __LINE__);
    test.IsTrue((str2 <= str1), __LINE__);
    test.IsTrue((str2 < str1), __LINE__);

    str1 = "a";
    str2 = "B";
    test.IsTrue((str1 >= str2), __LINE__);
    test.IsTrue((str1 > str2), __LINE__);
    test.IsFalse((str1 <= str2), __LINE__);
    test.IsFalse((str1 < str2), __LINE__);
    //
    test.IsFalse((str2 >= str1), __LINE__);
    test.IsFalse((str2 > str1), __LINE__);
    test.IsTrue((str2 <= str1), __LINE__);
    test.IsTrue((str2 < str1), __LINE__);

    str1 = "aa";
    str2 = "aA";
    test.IsTrue((str1 >= str2), __LINE__);
    test.IsTrue((str1 > str2), __LINE__);
    test.IsFalse((str1 <= str2), __LINE__);
    test.IsFalse((str1 < str2), __LINE__);
    //
    test.IsFalse((str2 >= str1), __LINE__);
    test.IsFalse((str2 > str1), __LINE__);
    test.IsTrue((str2 <= str1), __LINE__);
    test.IsTrue((str2 < str1), __LINE__);

    str1 = "2021";
    str2 = "2018";
    test.IsTrue((str1 >= str2), __LINE__);
    test.IsTrue((str1 > str2), __LINE__);
    test.IsFalse((str1 <= str2), __LINE__);
    test.IsFalse((str1 < str2), __LINE__);
    //
    test.IsFalse((str2 >= str1), __LINE__);
    test.IsFalse((str2 > str1), __LINE__);
    test.IsTrue((str2 <= str1), __LINE__);
    test.IsTrue((str2 < str1), __LINE__);
}